

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11GlxPlatform.cpp
# Opt level: O0

void __thiscall
tcu::x11::glx::GlxWindow::GlxWindow(GlxWindow *this,GlxVisual *visual,RenderConfig *cfg)

{
  int width;
  int height;
  XlibDisplay *display;
  GlxDisplay *pGVar1;
  Visual *visual_00;
  Window *pWVar2;
  GLXWindow GVar3;
  RenderConfig *cfg_local;
  GlxVisual *visual_local;
  GlxWindow *this_local;
  
  GlxDrawable::GlxDrawable(&this->super_GlxDrawable);
  (this->super_GlxDrawable)._vptr_GlxDrawable = (_func_int **)&PTR__GlxWindow_0066f2c0;
  pGVar1 = GlxVisual::getGlxDisplay(visual);
  this->m_x11Display = &pGVar1->super_XlibDisplay;
  display = this->m_x11Display;
  width = cfg->width;
  height = cfg->height;
  visual_00 = GlxVisual::getXVisual(visual);
  XlibWindow::XlibWindow(&this->m_x11Window,display,width,height,visual_00);
  pWVar2 = XlibWindow::getXID(&this->m_x11Window);
  GVar3 = GlxVisual::createWindow(visual,*pWVar2);
  this->m_GLXDrawable = GVar3;
  XlibWindow::setVisibility(&this->m_x11Window,cfg->windowVisibility != VISIBILITY_HIDDEN);
  return;
}

Assistant:

GlxWindow::GlxWindow (GlxVisual& visual, const RenderConfig& cfg)
	: m_x11Display	(visual.getGlxDisplay())
	, m_x11Window	(m_x11Display, cfg.width, cfg.height,
					 visual.getXVisual())
	, m_GLXDrawable	(visual.createWindow(m_x11Window.getXID()))
{
	m_x11Window.setVisibility(cfg.windowVisibility != RenderConfig::VISIBILITY_HIDDEN);
}